

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

uint * Kit_DsdTruthComputeNodeTwo_rec
                 (Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,int Id,uint uSupp,int iVar,uint *pTruthDec)

{
  ushort uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  uint *puVar9;
  ulong uVar10;
  long lVar11;
  uint *puVar12;
  char cVar13;
  Kit_DsdObj_t KVar14;
  ulong uVar15;
  int Id_1;
  ushort uVar16;
  uint uVar17;
  long lVar18;
  ushort uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  Kit_DsdObj_t *pKVar26;
  uint uVar27;
  bool bVar28;
  bool bVar29;
  int pfBoundSet [16];
  uint *pTruthFans [16];
  uint local_f8 [16];
  uint *local_b8 [17];
  
  if (uSupp == 0) {
    __assert_fail("uSupp > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                  ,0x35d,
                  "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                 );
  }
  if (-1 < Id) {
    uVar1 = pNtk->nVars;
    uVar17 = (uint)pNtk->nNodes + (uint)uVar1;
    if (Id < (int)uVar17) {
      if (Id < (int)(uint)uVar1) {
        pKVar26 = (Kit_DsdObj_t *)0x0;
      }
      else {
        pKVar26 = pNtk->pNodes[(long)Id - (ulong)uVar1];
      }
      if (p->vTtNodes->nSize <= Id) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar9 = (uint *)p->vTtNodes->pArray[(uint)Id];
      if (pKVar26 == (Kit_DsdObj_t *)0x0) {
        if ((int)(uint)uVar1 <= Id) {
          __assert_fail("Id < pNtk->nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0x364,
                        "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                       );
        }
      }
      else {
        KVar14 = *pKVar26;
        uVar20 = (uint)KVar14 >> 6 & 7;
        if (uVar20 == 1) {
          __assert_fail("pObj->Type != KIT_DSD_CONST1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0x367,
                        "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                       );
        }
        if (uVar20 == 2) {
          __assert_fail("pObj->Type != KIT_DSD_VAR",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0x368,
                        "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                       );
        }
        uVar20 = (uint)KVar14 >> 0x1a;
        uVar27 = 0;
        uVar21 = 0;
        if (0x3ffffff < (uint)KVar14) {
          uVar22 = 0;
          uVar21 = 0;
          uVar27 = 0;
          do {
            uVar16 = *(ushort *)((long)&pKVar26[1].field_0x0 + uVar22 * 2) >> 1;
            if (uVar17 <= uVar16) goto LAB_005c9d46;
            if (pNtk->pSupps == (uint *)0x0) {
              uVar23 = 0;
            }
            else if (uVar16 < uVar1) {
              uVar23 = 1 << ((byte)uVar16 & 0x1f);
            }
            else {
              uVar23 = pNtk->pSupps[(ulong)(uint)uVar16 - (ulong)uVar1];
            }
            uVar24 = uVar23 & uSupp;
            uVar25 = uVar24;
            if (uVar24 != 0) {
              uVar25 = uVar23;
            }
            uVar27 = uVar27 + (uVar24 != 0);
            uVar21 = uVar21 | uVar25;
            uVar22 = uVar22 + 1;
          } while (uVar20 != uVar22);
        }
        if ((uVar27 == 0) || (uVar27 == uVar20)) {
          puVar9 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,Id,0);
          return puVar9;
        }
        if ((uVar21 & ~uSupp) == 0) {
          if (uVar20 <= uVar27) {
            __assert_fail("nPartial < pObj->nFans",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                          ,0x3a4,
                          "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                         );
          }
          KVar14 = *pKVar26;
          if ((uint)KVar14 < 0x4000000) {
            uVar15 = (ulong)((uint)KVar14 >> 0x1a);
          }
          else {
            uVar22 = 0;
            do {
              uVar16 = *(ushort *)((long)&pKVar26[1].field_0x0 + uVar22 * 2) >> 1;
              uVar17 = (uint)uVar16;
              puVar12 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,uVar17,0);
              local_b8[uVar22] = puVar12;
              uVar1 = pNtk->nVars;
              if ((uint)pNtk->nNodes + (uint)uVar1 <= uVar17) {
LAB_005c9d46:
                __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                              ,0x9c,"unsigned int Kit_DsdLitSupport(Kit_DsdNtk_t *, int)");
              }
              if (pNtk->pSupps == (uint *)0x0) {
                uVar17 = 0;
              }
              else if (uVar16 < uVar1) {
                uVar17 = 1 << ((byte)uVar16 & 0x1f);
              }
              else {
                uVar17 = pNtk->pSupps[(ulong)uVar17 - (ulong)uVar1];
              }
              local_f8[uVar22] = (uint)((uVar17 & uSupp) != 0);
              uVar22 = uVar22 + 1;
              KVar14 = *pKVar26;
              uVar15 = (ulong)((uint)KVar14 >> 0x1a);
            } while (uVar22 < uVar15);
          }
          uVar17 = (uint)KVar14 >> 6 & 7;
          cVar13 = (char)iVar;
          if (uVar17 != 5) {
            if (uVar17 == 4) {
              uVar5 = pNtk->nVars;
              uVar17 = 1 << ((char)uVar5 - 5U & 0x1f);
              if ((ushort)uVar5 < 6) {
                uVar17 = 1;
              }
              uVar22 = (ulong)uVar17;
              if (iVar < 5) {
                if (0 < (int)uVar17) {
                  uVar20 = (&DAT_009f2b30)[iVar];
                  uVar15 = 0;
                  do {
                    puVar9[uVar15] = uVar20;
                    uVar15 = uVar15 + 1;
                  } while (uVar22 != uVar15);
                }
              }
              else if (0 < (int)uVar17) {
                uVar15 = 0;
                do {
                  puVar9[uVar15] = -(uint)((1 << (cVar13 - 5U & 0x1f) & (uint)uVar15) != 0);
                  uVar15 = uVar15 + 1;
                } while (uVar22 != uVar15);
              }
              if (0 < (int)uVar17) {
                memset(pTruthDec,0,uVar22 << 2);
              }
              bVar29 = true;
              if (0x3ffffff < (uint)*pKVar26) {
                uVar15 = 0;
                uVar1 = 0;
                do {
                  uVar19 = uVar1;
                  uVar16 = *(ushort *)((long)&pKVar26[1].field_0x0 + uVar15 * 2);
                  puVar12 = local_b8[uVar15];
                  if (local_f8[uVar15] == 0) {
                    lVar11 = uVar22 + 1;
                    if (0 < (int)uVar17) {
                      do {
                        puVar9[lVar11 + -2] = puVar9[lVar11 + -2] ^ puVar12[lVar11 + -2];
                        lVar11 = lVar11 + -1;
                      } while (1 < lVar11);
                    }
                  }
                  else {
                    lVar11 = uVar22 + 1;
                    if (0 < (int)uVar17) {
                      do {
                        pTruthDec[lVar11 + -2] = pTruthDec[lVar11 + -2] ^ puVar12[lVar11 + -2];
                        lVar11 = lVar11 + -1;
                      } while (1 < lVar11);
                    }
                  }
                  uVar16 = uVar16 & 1;
                  uVar15 = uVar15 + 1;
                  uVar1 = uVar19 ^ uVar16;
                } while (uVar15 < (uint)*pKVar26 >> 0x1a);
                bVar29 = uVar19 == uVar16;
              }
              if ((int)uVar17 < 1) {
                return puVar9;
              }
              if (bVar29) {
                return puVar9;
              }
              lVar11 = uVar22 + 1;
              do {
                puVar9[lVar11 + -2] = ~puVar9[lVar11 + -2];
                lVar11 = lVar11 + -1;
              } while (1 < lVar11);
              return puVar9;
            }
            if (uVar17 != 3) {
              __assert_fail("pObj->Type == KIT_DSD_PRIME",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                            ,0x3cc,
                            "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                           );
            }
            uVar3 = pNtk->nVars;
            uVar17 = 1 << ((char)uVar3 - 5U & 0x1f);
            if ((ushort)uVar3 < 6) {
              uVar17 = 1;
            }
            uVar22 = (ulong)uVar17;
            if (iVar < 5) {
              if (0 < (int)uVar17) {
                uVar20 = (&DAT_009f2b30)[iVar];
                uVar15 = 0;
                do {
                  puVar9[uVar15] = uVar20;
                  uVar15 = uVar15 + 1;
                } while (uVar22 != uVar15);
              }
            }
            else if (0 < (int)uVar17) {
              uVar15 = 0;
              do {
                puVar9[uVar15] = -(uint)((1 << (cVar13 - 5U & 0x1f) & (uint)uVar15) != 0);
                uVar15 = uVar15 + 1;
              } while (uVar22 != uVar15);
            }
            if (0 < (int)uVar17) {
              memset(pTruthDec,0xff,uVar22 << 2);
            }
            if ((uint)*pKVar26 < 0x4000000) {
              return puVar9;
            }
            lVar11 = uVar22 + 1;
            uVar22 = 0;
            do {
              uVar1 = *(ushort *)((long)&pKVar26[1].field_0x0 + uVar22 * 2);
              puVar12 = local_b8[uVar22];
              if (local_f8[uVar22] == 0) {
                if ((uVar1 & 1) == 0) {
                  lVar18 = lVar11;
                  if (0 < (int)uVar17) {
                    do {
                      puVar9[lVar18 + -2] = puVar9[lVar18 + -2] & puVar12[lVar18 + -2];
                      lVar18 = lVar18 + -1;
                    } while (1 < lVar18);
                  }
                }
                else {
                  lVar18 = lVar11;
                  if (0 < (int)uVar17) {
                    do {
                      puVar9[lVar18 + -2] = puVar9[lVar18 + -2] & ~puVar12[lVar18 + -2];
                      lVar18 = lVar18 + -1;
                    } while (1 < lVar18);
                  }
                }
              }
              else if ((uVar1 & 1) == 0) {
                lVar18 = lVar11;
                if (0 < (int)uVar17) {
                  do {
                    pTruthDec[lVar18 + -2] = pTruthDec[lVar18 + -2] & puVar12[lVar18 + -2];
                    lVar18 = lVar18 + -1;
                  } while (1 < lVar18);
                }
              }
              else {
                lVar18 = lVar11;
                if (0 < (int)uVar17) {
                  do {
                    pTruthDec[lVar18 + -2] = pTruthDec[lVar18 + -2] & ~puVar12[lVar18 + -2];
                    lVar18 = lVar18 + -1;
                  } while (1 < lVar18);
                }
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 < (uint)*pKVar26 >> 0x1a);
            return puVar9;
          }
          if (uVar27 != 1) {
            __assert_fail("nPartial == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                          ,0x3cd,
                          "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                         );
          }
          bVar28 = (int)uVar15 == 0;
          bVar29 = !bVar28;
          if (bVar28) {
LAB_005c9dc2:
            __assert_fail("i < pObj->nFans",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                          ,0x3d3,
                          "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                         );
          }
          if (local_f8[0] == 0) {
            uVar22 = 0;
            do {
              if (uVar15 - 1 == uVar22) goto LAB_005c9dc2;
              uVar10 = uVar22 + 1;
              lVar11 = uVar22 + 1;
              uVar22 = uVar10;
            } while (local_f8[lVar11] == 0);
            bVar29 = uVar10 < uVar15;
          }
          else {
            uVar10 = 0;
          }
          if (!bVar29) goto LAB_005c9dc2;
          puVar12 = local_b8[uVar10];
          uVar6 = pNtk->nVars;
          uVar17 = 1 << ((char)uVar6 - 5U & 0x1f);
          if ((ushort)uVar6 < 6) {
            uVar17 = 1;
          }
          if (0 < (int)uVar17) {
            lVar11 = (ulong)uVar17 + 1;
            do {
              pTruthDec[lVar11 + -2] = puVar12[lVar11 + -2];
              lVar11 = lVar11 + -1;
            } while (1 < lVar11);
          }
          if (iVar < 5) {
            if (0 < (int)uVar17) {
              uVar20 = (&DAT_009f2b30)[iVar];
              uVar22 = 0;
              do {
                puVar12[uVar22] = uVar20;
                uVar22 = uVar22 + 1;
              } while (uVar17 != uVar22);
            }
          }
          else if (0 < (int)uVar17) {
            uVar22 = 0;
            do {
              puVar12[uVar22] = -(uint)((1 << (cVar13 - 5U & 0x1f) & (uint)uVar22) != 0);
              uVar22 = uVar22 + 1;
            } while (uVar17 != uVar22);
          }
        }
        else {
          if (uVar27 != 1) {
            __assert_fail("nPartial == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                          ,0x380,
                          "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                         );
          }
          KVar14 = *pKVar26;
          if (0x3ffffff < (uint)KVar14) {
            uVar22 = 0;
            do {
              uVar16 = *(ushort *)((long)&pKVar26[1].field_0x0 + uVar22 * 2) >> 1;
              uVar17 = (uint)uVar16;
              uVar1 = pNtk->nVars;
              if ((uint)pNtk->nNodes + (uint)uVar1 <= uVar17) goto LAB_005c9d46;
              if (pNtk->pSupps == (uint *)0x0) {
                uVar20 = 0;
              }
              else if (uVar16 < uVar1) {
                uVar20 = 1 << ((byte)uVar16 & 0x1f);
              }
              else {
                uVar20 = pNtk->pSupps[(ulong)uVar17 - (ulong)uVar1];
              }
              if ((uVar20 & uSupp) == 0) {
                puVar12 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,uVar17,0);
              }
              else {
                puVar12 = Kit_DsdTruthComputeNodeTwo_rec(p,pNtk,uVar17,uSupp,iVar,pTruthDec);
              }
              local_b8[uVar22] = puVar12;
              uVar22 = uVar22 + 1;
              KVar14 = *pKVar26;
            } while (uVar22 < (uint)KVar14 >> 0x1a);
          }
          uVar17 = (uint)KVar14 >> 6 & 7;
          if (uVar17 != 5) {
            if (uVar17 == 4) {
              uVar4 = pNtk->nVars;
              uVar17 = 1 << ((char)uVar4 - 5U & 0x1f);
              if ((ushort)uVar4 < 6) {
                uVar17 = 1;
              }
              uVar22 = (ulong)uVar17;
              if (0 < (int)uVar17) {
                memset(puVar9,0,uVar22 * 4);
              }
              bVar29 = true;
              if (0x3ffffff < (uint)*pKVar26) {
                uVar15 = 0;
                uVar1 = 0;
                do {
                  uVar19 = uVar1;
                  uVar16 = *(ushort *)((long)&pKVar26[1].field_0x0 + uVar15 * 2);
                  if (0 < (int)uVar17) {
                    puVar12 = local_b8[uVar15];
                    lVar11 = uVar22 + 1;
                    do {
                      puVar9[lVar11 + -2] = puVar9[lVar11 + -2] ^ puVar12[lVar11 + -2];
                      lVar11 = lVar11 + -1;
                    } while (1 < lVar11);
                  }
                  uVar16 = uVar16 & 1;
                  uVar15 = uVar15 + 1;
                  uVar1 = uVar19 ^ uVar16;
                } while (uVar15 < (uint)*pKVar26 >> 0x1a);
                bVar29 = uVar19 == uVar16;
              }
              if ((int)uVar17 < 1) {
                return puVar9;
              }
              if (bVar29) {
                return puVar9;
              }
              lVar11 = uVar22 + 1;
              do {
                puVar9[lVar11 + -2] = ~puVar9[lVar11 + -2];
                lVar11 = lVar11 + -1;
              } while (1 < lVar11);
              return puVar9;
            }
            if (uVar17 != 3) {
              __assert_fail("pObj->Type == KIT_DSD_PRIME",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                            ,0x39f,
                            "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                           );
            }
            uVar2 = pNtk->nVars;
            uVar17 = 1 << ((char)uVar2 - 5U & 0x1f);
            if ((ushort)uVar2 < 6) {
              uVar17 = 1;
            }
            if (0 < (int)uVar17) {
              memset(puVar9,0xff,(ulong)uVar17 * 4);
            }
            if ((uint)*pKVar26 < 0x4000000) {
              return puVar9;
            }
            lVar11 = (ulong)uVar17 + 1;
            uVar22 = 0;
            do {
              puVar12 = local_b8[uVar22];
              if ((*(byte *)((long)&pKVar26[1].field_0x0 + uVar22 * 2) & 1) == 0) {
                lVar18 = lVar11;
                if (0 < (int)uVar17) {
                  do {
                    puVar9[lVar18 + -2] = puVar9[lVar18 + -2] & puVar12[lVar18 + -2];
                    lVar18 = lVar18 + -1;
                  } while (1 < lVar18);
                }
              }
              else {
                lVar18 = lVar11;
                if (0 < (int)uVar17) {
                  do {
                    puVar9[lVar18 + -2] = puVar9[lVar18 + -2] & ~puVar12[lVar18 + -2];
                    lVar18 = lVar18 + -1;
                  } while (1 < lVar18);
                }
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 < (uint)*pKVar26 >> 0x1a);
            return puVar9;
          }
        }
        KVar14 = *pKVar26;
        if ((uint)KVar14 < 0x4000000) {
          uVar17 = (uint)KVar14 >> 0x1a;
        }
        else {
          uVar22 = 0;
          do {
            if ((*(byte *)((long)&pKVar26[1].field_0x0 + uVar22 * 2) & 1) != 0) {
              uVar7 = pNtk->nVars;
              uVar17 = 1 << ((char)uVar7 - 5U & 0x1f);
              if ((ushort)uVar7 < 6) {
                uVar17 = 1;
              }
              if (0 < (int)uVar17) {
                puVar12 = local_b8[uVar22];
                lVar11 = (ulong)uVar17 + 1;
                do {
                  puVar12[lVar11 + -2] = ~puVar12[lVar11 + -2];
                  lVar11 = lVar11 + -1;
                } while (1 < lVar11);
              }
            }
            uVar22 = uVar22 + 1;
            KVar14 = *pKVar26;
            uVar17 = (uint)KVar14 >> 0x1a;
          } while (uVar22 < uVar17);
        }
        puVar12 = (uint *)0x0;
        if (((uint)KVar14 & 0x1c0) == 0x140) {
          puVar12 = (uint *)((long)&pKVar26[1].field_0x0 + (ulong)((uint)KVar14 >> 8 & 0x3fc));
        }
        puVar12 = Kit_TruthCompose(p->dd,puVar12,uVar17,local_b8,(uint)pNtk->nVars,p->vTtBdds,
                                   p->vNodes);
        uVar8 = pNtk->nVars;
        uVar17 = 1 << ((char)uVar8 - 5U & 0x1f);
        if ((ushort)uVar8 < 6) {
          uVar17 = 1;
        }
        if (0 < (int)uVar17) {
          lVar11 = (ulong)uVar17 + 1;
          do {
            puVar9[lVar11 + -2] = puVar12[lVar11 + -2];
            lVar11 = lVar11 + -1;
          } while (1 < lVar11);
        }
      }
      return puVar9;
    }
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

unsigned * Kit_DsdTruthComputeNodeTwo_rec( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, int Id, unsigned uSupp, int iVar, unsigned * pTruthDec )
{
    Kit_DsdObj_t * pObj;
    int pfBoundSet[16];
    unsigned * pTruthRes, * pTruthFans[16], * pTruthTemp;
    unsigned i, iLit, fCompl, nPartial, uSuppFan, uSuppCur;
//    unsigned m, nMints, * pTruthPrime, * pTruthMint; 
    assert( uSupp > 0 );

    // get the node with this ID
    pObj = Kit_DsdNtkObj( pNtk, Id );
    pTruthRes = (unsigned *)Vec_PtrEntry( p->vTtNodes, Id );
    if ( pObj == NULL )
    {
        assert( Id < pNtk->nVars );
        return pTruthRes;
    }
    assert( pObj->Type != KIT_DSD_CONST1 );
    assert( pObj->Type != KIT_DSD_VAR );

    // count the number of intersecting fanins 
    // collect the total support of the intersecting fanins
    nPartial = 0;
    uSuppFan = 0;
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
    {
        uSuppCur = Kit_DsdLitSupport(pNtk, iLit);
        if ( uSupp & uSuppCur )
        {
            nPartial++;
            uSuppFan |= uSuppCur;
        }
    }

    // if there is no intersection, or full intersection, use simple procedure
    if ( nPartial == 0 || nPartial == pObj->nFans )
        return Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Id, 0 );

    // if support of the component includes some other variables
    // we need to continue constructing it as usual by the two-function procedure
    if ( uSuppFan != (uSuppFan & uSupp) )
    {
        assert( nPartial == 1 );
//        return Kit_DsdTruthComputeNodeTwo_rec( p, pNtk, Id, uSupp, iVar, pTruthDec );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        {
            if ( uSupp & Kit_DsdLitSupport(pNtk, iLit) )
                pTruthFans[i] = Kit_DsdTruthComputeNodeTwo_rec( p, pNtk, Abc_Lit2Var(iLit), uSupp, iVar, pTruthDec );
            else
                pTruthFans[i] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), 0 );
        }

        // create composition/decomposition functions
        if ( pObj->Type == KIT_DSD_AND )
        {
            Kit_TruthFill( pTruthRes, pNtk->nVars );
            Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
                Kit_TruthAndPhase( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
            return pTruthRes;
        }
        if ( pObj->Type == KIT_DSD_XOR )
        {
            Kit_TruthClear( pTruthRes, pNtk->nVars );
            fCompl = 0;
            Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            {
                fCompl ^= Abc_LitIsCompl(iLit);
                Kit_TruthXor( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars );
            }
            if ( fCompl )
                Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
            return pTruthRes;
        }
        assert( pObj->Type == KIT_DSD_PRIME );
    }
    else
    {
        assert( uSuppFan == (uSuppFan & uSupp) );
        assert( nPartial < pObj->nFans );
        // the support of the insecting component(s) is contained in the bound-set
        // and yet there are components that are not contained in the bound set

        // solve the fanins and collect info, which components belong to the bound set
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        {
            pTruthFans[i] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), 0 );
            pfBoundSet[i] = (int)((uSupp & Kit_DsdLitSupport(pNtk, iLit)) > 0);
        }

        // create composition/decomposition functions
        if ( pObj->Type == KIT_DSD_AND )
        {
            Kit_TruthIthVar( pTruthRes, pNtk->nVars, iVar );
            Kit_TruthFill( pTruthDec, pNtk->nVars );
            Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
                if ( pfBoundSet[i] )
                    Kit_TruthAndPhase( pTruthDec, pTruthDec, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
                else
                    Kit_TruthAndPhase( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
            return pTruthRes;
        }
        if ( pObj->Type == KIT_DSD_XOR )
        {
            Kit_TruthIthVar( pTruthRes, pNtk->nVars, iVar );
            Kit_TruthClear( pTruthDec, pNtk->nVars );
            fCompl = 0;
            Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            {
                fCompl ^= Abc_LitIsCompl(iLit);
                if ( pfBoundSet[i] )
                    Kit_TruthXor( pTruthDec, pTruthDec, pTruthFans[i], pNtk->nVars );
                else
                    Kit_TruthXor( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars );
            }
            if ( fCompl )
                Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
            return pTruthRes;
        }
        assert( pObj->Type == KIT_DSD_PRIME );
        assert( nPartial == 1 );

        // find the only non-empty component
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            if ( pfBoundSet[i] )
                break;
        assert( i < pObj->nFans );

        // save this component as the decomposed function
        Kit_TruthCopy( pTruthDec, pTruthFans[i], pNtk->nVars );
        // set the corresponding component to be the new variable
        Kit_TruthIthVar( pTruthFans[i], pNtk->nVars, iVar );
    }
/*
    // get the truth table of the prime node
    pTruthPrime = Kit_DsdObjTruth( pObj );
    // get storage for the temporary minterm
    pTruthMint = Vec_PtrEntry(p->vTtNodes, pNtk->nVars + pNtk->nNodes);
    // go through the minterms
    nMints = (1 << pObj->nFans);
    Kit_TruthClear( pTruthRes, pNtk->nVars );
    for ( m = 0; m < nMints; m++ )
    {
        if ( !Kit_TruthHasBit(pTruthPrime, m) )
            continue;
        Kit_TruthFill( pTruthMint, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            Kit_TruthAndPhase( pTruthMint, pTruthMint, pTruthFans[i], pNtk->nVars, 0, ((m & (1<<i)) == 0) ^ Abc_LitIsCompl(iLit) );
        Kit_TruthOr( pTruthRes, pTruthRes, pTruthMint, pNtk->nVars );
    }
*/
//    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
//        assert( !Abc_LitIsCompl(iLit) );
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthFans[i], pTruthFans[i], pNtk->nVars );
    pTruthTemp = Kit_TruthCompose( p->dd, Kit_DsdObjTruth(pObj), pObj->nFans, pTruthFans, pNtk->nVars, p->vTtBdds, p->vNodes );
    Kit_TruthCopy( pTruthRes, pTruthTemp, pNtk->nVars );
    return pTruthRes;
}